

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O1

int myMonitorFunction(void *cvode_mem,void *user_data)

{
  sunrealtype t;
  sunrealtype local_20;
  
  local_20 = 0.0;
  CVodeGetCurrentTime(cvode_mem,&local_20);
  PrintOutput(cvode_mem,*(N_Vector *)((long)user_data + 0x998),local_20);
  PrintStats(cvode_mem,*(int *)((long)user_data + 0x9a0),0);
  return 0;
}

Assistant:

static int myMonitorFunction(void* cvode_mem, void* user_data)
{
  UserData data = (UserData)user_data;
  sunrealtype t = 0;

  CVodeGetCurrentTime(cvode_mem, &t);
  PrintOutput(cvode_mem, data->u, t);
  PrintStats(cvode_mem, data->linsolver, 0);

  return (0);
}